

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderNinjaBar(CHud *this,float x,float y,float Progress)

{
  IGraphics *pIVar1;
  CDataSprite *pCVar2;
  long in_FS_OFFSET;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_98;
  float local_94;
  undefined8 local_90;
  CQuadItem QuadEmpty;
  CDataSprite SpriteBarFull;
  CQuadItem QuadFull;
  float local_40;
  float local_3c;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  fVar5 = 1.0;
  if (Progress <= 1.0) {
    fVar5 = Progress;
  }
  fVar5 = (float)(~-(uint)(Progress < 0.0) & (uint)fVar5);
  local_38 = 0x4140000040c00000;
  local_40 = x;
  local_3c = y;
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,g_pData->m_aSprites + 0x41,0,0,0);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_40,1);
  fVar4 = x + 6.0;
  fVar3 = fVar5 * 108.0;
  QuadFull.m_Height = 12.0;
  pCVar2 = g_pData->m_aSprites;
  SpriteBarFull.m_pName = pCVar2[0x42].m_pName;
  SpriteBarFull.m_pSet = pCVar2[0x42].m_pSet;
  SpriteBarFull.m_X = pCVar2[0x42].m_X;
  SpriteBarFull.m_Y = pCVar2[0x42].m_Y;
  SpriteBarFull.m_W = pCVar2[0x42].m_W;
  SpriteBarFull.m_H = pCVar2[0x42].m_H;
  QuadFull.m_X = fVar4;
  QuadFull.m_Y = y;
  QuadFull.m_Width = fVar3;
  if (0.1 <= fVar5) {
    CRenderTools::SelectSprite
              (&((this->super_CComponent).m_pClient)->m_RenderTools,&SpriteBarFull,0,0,0);
  }
  else {
    pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x1a])
              ((float)SpriteBarFull.m_X / (float)(SpriteBarFull.m_pSet)->m_Gridx,
               (float)SpriteBarFull.m_Y / (float)(SpriteBarFull.m_pSet)->m_Gridy,
               ((float)SpriteBarFull.m_W * 0.1 + (float)SpriteBarFull.m_X + -0.03125) /
               (float)(SpriteBarFull.m_pSet)->m_Gridx,
               ((float)(SpriteBarFull.m_Y + SpriteBarFull.m_H) + -0.03125) /
               (float)(SpriteBarFull.m_pSet)->m_Gridy,pIVar1,0xffffffffffffffff);
  }
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&QuadFull,1);
  pCVar2 = g_pData->m_aSprites;
  fVar5 = (float)pCVar2[0x43].m_X + 0.1;
  fVar6 = (float)(pCVar2[0x43].m_pSet)->m_Gridx;
  fVar7 = (float)(pCVar2[0x43].m_pSet)->m_Gridy;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1a])
            (fVar5 / fVar6,(float)pCVar2[0x43].m_Y / fVar7,
             ((float)pCVar2[0x43].m_W * 0.5 + fVar5 + -0.03125) / fVar6,
             ((float)pCVar2[0x43].m_H + (float)pCVar2[0x43].m_Y + -0.03125) / fVar7,pIVar1,
             0xffffffffffffffff);
  QuadEmpty.m_X = fVar3 + fVar4;
  QuadEmpty.m_Height = 12.0;
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  QuadEmpty.m_Y = y;
  QuadEmpty.m_Width = 108.0 - fVar3;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&QuadEmpty,1);
  local_98 = fVar4 + 108.0;
  local_90 = 0x4140000040c00000;
  local_94 = y;
  CRenderTools::SelectSprite
            (&((this->super_CComponent).m_pClient)->m_RenderTools,g_pData->m_aSprites + 0x44,0,0,0);
  pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x1d])(pIVar1,&local_98,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderNinjaBar(float x, float y, float Progress)
{
	Progress = clamp(Progress, 0.0f, 1.0f);
	const float EndWidth = 6.0f;
	const float BarHeight = 12.0f;
	const float WholeBarWidth = 120.f;
	const float MiddleBarWidth = WholeBarWidth - (EndWidth * 2.0f);

	IGraphics::CQuadItem QuadStartFull(x, y, EndWidth, BarHeight);
	RenderTools()->SelectSprite(&g_pData->m_aSprites[SPRITE_NINJA_BAR_FULL_LEFT]);
	Graphics()->QuadsDrawTL(&QuadStartFull, 1);
	x += EndWidth;

	const float FullBarWidth = MiddleBarWidth * Progress;
	const float EmptyBarWidth = MiddleBarWidth - FullBarWidth;

	// full bar
	IGraphics::CQuadItem QuadFull(x, y, FullBarWidth, BarHeight);

	CDataSprite SpriteBarFull = g_pData->m_aSprites[SPRITE_NINJA_BAR_FULL];
	// prevent pixel puree, select only a small slice
	if(Progress < 0.1f)
	{
		int spx = SpriteBarFull.m_X;
		int spy = SpriteBarFull.m_Y;
		float w = SpriteBarFull.m_W * 0.1f; // magic here
		int h = SpriteBarFull.m_H;
		int cx = SpriteBarFull.m_pSet->m_Gridx;
		int cy = SpriteBarFull.m_pSet->m_Gridy;
		float x1 = spx/(float)cx;
		float x2 = (spx+w-1/32.0f)/(float)cx;
		float y1 = spy/(float)cy;
		float y2 = (spy+h-1/32.0f)/(float)cy;

		Graphics()->QuadsSetSubset(x1, y1, x2, y2);
	}
	else
		RenderTools()->SelectSprite(&SpriteBarFull);

	Graphics()->QuadsDrawTL(&QuadFull, 1);

	// empty bar
	// select the middle portion of the sprite so we don't get edge bleeding
	const CDataSprite SpriteBarEmpty = g_pData->m_aSprites[SPRITE_NINJA_BAR_EMPTY];
	{
		float spx = SpriteBarEmpty.m_X + 0.1f;
		float spy = SpriteBarEmpty.m_Y;
		float w = SpriteBarEmpty.m_W * 0.5f;
		int h = SpriteBarEmpty.m_H;
		int cx = SpriteBarEmpty.m_pSet->m_Gridx;
		int cy = SpriteBarEmpty.m_pSet->m_Gridy;
		float x1 = spx/(float)cx;
		float x2 = (spx+w-1/32.0f)/(float)cx;
		float y1 = spy/(float)cy;
		float y2 = (spy+h-1/32.0f)/(float)cy;

		Graphics()->QuadsSetSubset(x1, y1, x2, y2);
	}

	IGraphics::CQuadItem QuadEmpty(x + FullBarWidth, y, EmptyBarWidth, BarHeight);
	Graphics()->QuadsDrawTL(&QuadEmpty, 1);

	x += MiddleBarWidth;

	IGraphics::CQuadItem QuadEndEmpty(x, y, EndWidth, BarHeight);
	RenderTools()->SelectSprite(&g_pData->m_aSprites[SPRITE_NINJA_BAR_EMPTY_RIGHT]);
	Graphics()->QuadsDrawTL(&QuadEndEmpty, 1);
}